

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O2

void idct64x64_low8_sse4_1(__m128i *in,__m128i *out,int bit,int do_cols,int bd,int out_shift)

{
  int *piVar1;
  uint *puVar2;
  undefined4 uVar3;
  undefined1 *puVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  uint uVar24;
  uint uVar26;
  uint uVar27;
  undefined1 auVar25 [16];
  uint uVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  int iVar35;
  uint uVar36;
  int iVar42;
  uint uVar43;
  int iVar44;
  uint uVar45;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  int iVar46;
  uint uVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 local_678 [16];
  undefined1 local_658 [16];
  int local_648;
  int iStack_644;
  undefined8 uStack_640;
  undefined1 local_638 [16];
  __m128i cospi32;
  int local_618;
  int iStack_614;
  int iStack_610;
  int iStack_60c;
  __m128i cospim48;
  __m128i cospim16;
  __m128i cospi48;
  __m128i cospi16;
  __m128i clamp_hi;
  __m128i clamp_lo;
  __m128i rnding;
  __m128i cospim32;
  uint local_438 [4];
  uint local_428;
  int iStack_424;
  int iStack_420;
  int iStack_41c;
  uint local_418;
  int iStack_414;
  int iStack_410;
  int iStack_40c;
  uint local_408;
  int iStack_404;
  int iStack_400;
  int iStack_3fc;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined1 local_3b8 [16];
  int local_3a8;
  int iStack_3a4;
  int iStack_3a0;
  int iStack_39c;
  int local_398;
  int iStack_394;
  int iStack_390;
  int iStack_38c;
  undefined1 local_388 [16];
  undefined8 local_378;
  undefined8 uStack_370;
  int local_368;
  int iStack_364;
  int iStack_360;
  int iStack_35c;
  int local_358;
  int iStack_354;
  int iStack_350;
  int iStack_34c;
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  int local_328;
  int iStack_324;
  int iStack_320;
  int iStack_31c;
  int local_318;
  int iStack_314;
  int iStack_310;
  int iStack_30c;
  int local_308;
  int iStack_304;
  int iStack_300;
  int iStack_2fc;
  int local_2f8;
  int iStack_2f4;
  int iStack_2f0;
  int iStack_2ec;
  int local_2e8;
  int iStack_2e4;
  int iStack_2e0;
  int iStack_2dc;
  int local_2d8;
  int iStack_2d4;
  int iStack_2d0;
  int iStack_2cc;
  int local_2c8;
  int iStack_2c4;
  int iStack_2c0;
  int iStack_2bc;
  int local_2b8;
  int iStack_2b4;
  int iStack_2b0;
  int iStack_2ac;
  int local_2a8;
  int iStack_2a4;
  int iStack_2a0;
  int iStack_29c;
  int local_298;
  int iStack_294;
  int iStack_290;
  int iStack_28c;
  int local_288;
  int iStack_284;
  int iStack_280;
  int iStack_27c;
  int local_278;
  int iStack_274;
  int iStack_270;
  int iStack_26c;
  int local_268;
  int iStack_264;
  int iStack_260;
  int iStack_25c;
  int local_258;
  int iStack_254;
  int iStack_250;
  int iStack_24c;
  int local_248;
  int iStack_244;
  int iStack_240;
  int iStack_23c;
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  int local_218;
  int iStack_214;
  int iStack_210;
  int iStack_20c;
  int local_208;
  int iStack_204;
  int iStack_200;
  int iStack_1fc;
  int local_1f8;
  int iStack_1f4;
  int iStack_1f0;
  int iStack_1ec;
  int local_1e8;
  int iStack_1e4;
  int iStack_1e0;
  int iStack_1dc;
  int local_1d8;
  int iStack_1d4;
  int iStack_1d0;
  int iStack_1cc;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  int local_1a8;
  int iStack_1a4;
  int iStack_1a0;
  int iStack_19c;
  int local_198;
  int iStack_194;
  int iStack_190;
  int iStack_18c;
  int local_188;
  int iStack_184;
  int iStack_180;
  int iStack_17c;
  int local_178;
  int iStack_174;
  int iStack_170;
  int iStack_16c;
  int local_168;
  int iStack_164;
  int iStack_160;
  int iStack_15c;
  int local_158;
  int iStack_154;
  int iStack_150;
  int iStack_14c;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  int local_128;
  int iStack_124;
  int iStack_120;
  int iStack_11c;
  int local_118;
  int iStack_114;
  int iStack_110;
  int iStack_10c;
  int local_108;
  int iStack_104;
  int iStack_100;
  int iStack_fc;
  int local_f8;
  int iStack_f4;
  int iStack_f0;
  int iStack_ec;
  int local_e8;
  int iStack_e4;
  int iStack_e0;
  int iStack_dc;
  int local_d8;
  int iStack_d4;
  int iStack_d0;
  int iStack_cc;
  int local_c8;
  int iStack_c4;
  int iStack_c0;
  int iStack_bc;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  int local_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  int local_88;
  int iStack_84;
  int iStack_80;
  int iStack_7c;
  int local_78;
  int iStack_74;
  int iStack_70;
  int iStack_6c;
  int local_68;
  int iStack_64;
  int iStack_60;
  int iStack_5c;
  int local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  undefined1 local_48 [16];
  
  auVar82 = ZEXT416((uint)bit);
  rnding[0]._0_4_ = 1 << ((char)bit - 1U & 0x1f);
  lVar8 = (long)bit * 0x100;
  iVar12 = bd + (uint)(do_cols == 0) * 2;
  iVar6 = 0x8000;
  if (0xf < iVar12 + 6) {
    iVar6 = 1 << ((char)iVar12 + 5U & 0x1f);
  }
  clamp_lo[0]._0_4_ = -iVar6;
  clamp_hi[0]._0_4_ = iVar6 + -1;
  uVar3 = *(undefined4 *)((long)vert_filter_length_chroma + lVar8 + 0x164);
  auVar37._4_4_ = uVar3;
  auVar37._0_4_ = uVar3;
  auVar37._8_4_ = uVar3;
  auVar37._12_4_ = uVar3;
  uVar3 = *(undefined4 *)((long)vert_filter_length_chroma + lVar8 + 0x168);
  auVar58._4_4_ = uVar3;
  auVar58._0_4_ = uVar3;
  auVar58._8_4_ = uVar3;
  auVar58._12_4_ = uVar3;
  uVar3 = *(undefined4 *)((long)vert_filter_length_chroma + lVar8 + 0x16c);
  auVar72._4_4_ = uVar3;
  auVar72._0_4_ = uVar3;
  auVar72._8_4_ = uVar3;
  auVar72._12_4_ = uVar3;
  iVar6 = *(int *)((long)vert_filter_length_chroma + lVar8 + 0x170);
  uVar3 = *(undefined4 *)((long)vert_filter_length_chroma + lVar8 + 0x178);
  auVar63._4_4_ = uVar3;
  auVar63._0_4_ = uVar3;
  auVar63._8_4_ = uVar3;
  auVar63._12_4_ = uVar3;
  cospi16[0]._0_4_ = *(int *)((long)vert_filter_length_chroma + lVar8 + 0x1a0);
  cospim16[0]._0_4_ = -(int)cospi16[0];
  cospi32[0]._0_4_ = *(int *)((long)vert_filter_length_chroma + lVar8 + 0x1e0);
  cospim32[0]._0_4_ = -(int)cospi32[0];
  cospi48[0]._0_4_ = *(int *)((long)vert_filter_length_chroma + lVar8 + 0x220);
  uVar3 = *(undefined4 *)((long)vert_filter_length_chroma + lVar8 + 0x250);
  auVar77._4_4_ = uVar3;
  auVar77._0_4_ = uVar3;
  auVar77._8_4_ = uVar3;
  auVar77._12_4_ = uVar3;
  iVar5 = -iVar6;
  cospim48[0]._0_4_ = -(int)cospi48[0];
  iVar12 = -*(int *)((long)vert_filter_length_chroma + lVar8 + 0x244);
  iVar10 = -*(int *)((long)vert_filter_length_chroma + lVar8 + 0x254);
  uVar3 = *(undefined4 *)((long)vert_filter_length_chroma + lVar8 + 0x25c);
  auVar66._4_4_ = uVar3;
  auVar66._0_4_ = uVar3;
  auVar66._8_4_ = uVar3;
  auVar66._12_4_ = uVar3;
  auVar29._4_4_ = iVar12;
  auVar29._0_4_ = iVar12;
  auVar29._8_4_ = iVar12;
  auVar29._12_4_ = iVar12;
  uVar3 = *(undefined4 *)((long)vert_filter_length_chroma + lVar8 + 0x17c);
  auVar48._4_4_ = uVar3;
  auVar48._0_4_ = uVar3;
  auVar48._8_4_ = uVar3;
  auVar48._12_4_ = uVar3;
  uVar3 = *(undefined4 *)((long)vert_filter_length_chroma + lVar8 + 0x174);
  auVar53._4_4_ = uVar3;
  auVar53._0_4_ = uVar3;
  auVar53._8_4_ = uVar3;
  auVar53._12_4_ = uVar3;
  uVar3 = *(undefined4 *)((long)vert_filter_length_chroma + lVar8 + 0x24c);
  auVar80._4_4_ = uVar3;
  auVar80._0_4_ = uVar3;
  auVar80._8_4_ = uVar3;
  auVar80._12_4_ = uVar3;
  iVar12 = -*(int *)((long)vert_filter_length_chroma + lVar8 + 0x248);
  auVar78._4_4_ = iVar10;
  auVar78._0_4_ = iVar10;
  auVar78._8_4_ = iVar10;
  auVar78._12_4_ = iVar10;
  auVar74._4_4_ = iVar12;
  auVar74._0_4_ = iVar12;
  auVar74._8_4_ = iVar12;
  auVar74._12_4_ = iVar12;
  uVar3 = *(undefined4 *)((long)vert_filter_length_chroma + lVar8 + 600);
  auVar60._4_4_ = uVar3;
  auVar60._0_4_ = uVar3;
  auVar60._8_4_ = uVar3;
  auVar60._12_4_ = uVar3;
  puVar4 = local_238;
  local_438[3] = (uint)((ulong)(*in)[1] >> 0x20);
  auVar38 = pmulld(auVar37,(undefined1  [16])in[1]);
  auVar67 = pmulld(auVar66,(undefined1  [16])in[1]);
  auVar30 = pmulld(auVar29,(undefined1  [16])in[7]);
  auVar49 = pmulld(auVar48,(undefined1  [16])in[7]);
  auVar54 = pmulld(auVar53,(undefined1  [16])in[5]);
  auVar81 = pmulld(auVar80,(undefined1  [16])in[5]);
  auVar79 = pmulld(auVar78,(undefined1  [16])in[3]);
  auVar73 = pmulld(auVar72,(undefined1  [16])in[3]);
  auVar59 = pmulld(auVar58,(undefined1  [16])in[2]);
  auVar61 = pmulld(auVar60,(undefined1  [16])in[2]);
  auVar75 = pmulld(auVar74,(undefined1  [16])in[6]);
  auVar64 = pmulld(auVar63,(undefined1  [16])in[6]);
  local_48._0_4_ = auVar38._0_4_ + (int)rnding[0] >> auVar82;
  local_48._4_4_ = auVar38._4_4_ + (int)rnding[0] >> auVar82;
  local_48._8_4_ = auVar38._8_4_ + (int)rnding[0] >> auVar82;
  local_48._12_4_ = auVar38._12_4_ + (int)rnding[0] >> auVar82;
  local_238._0_4_ = auVar67._0_4_ + (int)rnding[0] >> auVar82;
  local_238._4_4_ = auVar67._4_4_ + (int)rnding[0] >> auVar82;
  local_238._8_4_ = auVar67._8_4_ + (int)rnding[0] >> auVar82;
  local_238._12_4_ = auVar67._12_4_ + (int)rnding[0] >> auVar82;
  auVar68._4_4_ = iVar5;
  auVar68._0_4_ = iVar5;
  auVar68._8_4_ = iVar5;
  auVar68._12_4_ = iVar5;
  auVar69 = pmulld(auVar68,local_238);
  auVar17 = pmulld(local_48,auVar77);
  auVar13._4_4_ = iVar6;
  auVar13._0_4_ = iVar6;
  auVar13._8_4_ = iVar6;
  auVar13._12_4_ = iVar6;
  local_1c8._0_4_ = auVar30._0_4_ + (int)rnding[0] >> auVar82;
  local_1c8._4_4_ = auVar30._4_4_ + (int)rnding[0] >> auVar82;
  local_1c8._8_4_ = auVar30._8_4_ + (int)rnding[0] >> auVar82;
  local_1c8._12_4_ = auVar30._12_4_ + (int)rnding[0] >> auVar82;
  local_b8._0_4_ = auVar49._0_4_ + (int)rnding[0] >> auVar82;
  local_b8._4_4_ = auVar49._4_4_ + (int)rnding[0] >> auVar82;
  local_b8._8_4_ = auVar49._8_4_ + (int)rnding[0] >> auVar82;
  local_b8._12_4_ = auVar49._12_4_ + (int)rnding[0] >> auVar82;
  local_638._0_4_ = auVar54._0_4_ + (int)rnding[0] >> auVar82;
  local_638._4_4_ = auVar54._4_4_ + (int)rnding[0] >> auVar82;
  local_638._8_4_ = auVar54._8_4_ + (int)rnding[0] >> auVar82;
  local_638._12_4_ = auVar54._12_4_ + (int)rnding[0] >> auVar82;
  local_c8 = local_638._0_4_;
  iStack_c4 = local_638._4_4_;
  iStack_c0 = local_638._8_4_;
  iStack_bc = local_638._12_4_;
  local_1b8._0_8_ =
       CONCAT44(auVar81._4_4_ + (int)rnding[0] >> auVar82,auVar81._0_4_ + (int)rnding[0] >> auVar82)
  ;
  local_1b8._8_4_ = auVar81._8_4_ + (int)rnding[0] >> auVar82;
  local_1b8._12_4_ = auVar81._12_4_ + (int)rnding[0] >> auVar82;
  local_148._0_8_ =
       CONCAT44(auVar79._4_4_ + (int)rnding[0] >> auVar82,auVar79._0_4_ + (int)rnding[0] >> auVar82)
  ;
  local_148._8_4_ = auVar79._8_4_ + (int)rnding[0] >> auVar82;
  local_148._12_4_ = auVar79._12_4_ + (int)rnding[0] >> auVar82;
  local_138._0_8_ =
       CONCAT44(auVar73._4_4_ + (int)rnding[0] >> auVar82,auVar73._0_4_ + (int)rnding[0] >> auVar82)
  ;
  local_138._8_4_ = auVar73._8_4_ + (int)rnding[0] >> auVar82;
  local_138._12_4_ = auVar73._12_4_ + (int)rnding[0] >> auVar82;
  local_658._0_4_ = auVar59._0_4_;
  local_658._4_4_ = auVar59._4_4_;
  local_658._8_4_ = auVar59._8_4_;
  local_658._12_4_ = auVar59._12_4_;
  local_658._0_4_ = local_658._0_4_ + (int)rnding[0] >> auVar82;
  local_658._4_4_ = local_658._4_4_ + (int)rnding[0] >> auVar82;
  local_658._8_4_ = local_658._8_4_ + (int)rnding[0] >> auVar82;
  local_658._12_4_ = local_658._12_4_ + (int)rnding[0] >> auVar82;
  local_248 = local_658._0_4_;
  iStack_244 = local_658._4_4_;
  iStack_240 = local_658._8_4_;
  iStack_23c = local_658._12_4_;
  local_338._0_8_ =
       CONCAT44(auVar61._4_4_ + (int)rnding[0] >> auVar82,auVar61._0_4_ + (int)rnding[0] >> auVar82)
  ;
  local_338._8_4_ = auVar61._8_4_ + (int)rnding[0] >> auVar82;
  local_338._12_4_ = auVar61._12_4_ + (int)rnding[0] >> auVar82;
  local_2c8 = auVar75._0_4_ + (int)rnding[0] >> auVar82;
  iStack_2c4 = auVar75._4_4_ + (int)rnding[0] >> auVar82;
  iStack_2c0 = auVar75._8_4_ + (int)rnding[0] >> auVar82;
  iStack_2bc = auVar75._12_4_ + (int)rnding[0] >> auVar82;
  local_2b8 = auVar64._0_4_ + (int)rnding[0] >> auVar82;
  iStack_2b4 = auVar64._4_4_ + (int)rnding[0] >> auVar82;
  iStack_2b0 = auVar64._8_4_ + (int)rnding[0] >> auVar82;
  iStack_2ac = auVar64._12_4_ + (int)rnding[0] >> auVar82;
  auVar55 = pmulld((undefined1  [16])in[4],auVar13);
  auVar73 = pmulld((undefined1  [16])in[4],auVar77);
  auVar56 = pmulld(auVar77,local_238);
  auVar30 = pmulld(auVar13,local_48);
  iVar6 = *(int *)((long)vert_filter_length_chroma + lVar8 + 0x1d0);
  auVar18._4_4_ = iVar6;
  auVar18._0_4_ = iVar6;
  auVar18._8_4_ = iVar6;
  auVar18._12_4_ = iVar6;
  iVar12 = -*(int *)((long)vert_filter_length_chroma + lVar8 + 0x1f0);
  auVar76._4_4_ = iVar12;
  auVar76._0_4_ = iVar12;
  auVar76._8_4_ = iVar12;
  auVar76._12_4_ = iVar12;
  auVar38 = pmulld(local_1c8,auVar76);
  auVar75 = pmulld(auVar18,local_b8);
  iVar6 = -iVar6;
  auVar14._4_4_ = iVar6;
  auVar14._0_4_ = iVar6;
  auVar14._8_4_ = iVar6;
  auVar14._12_4_ = iVar6;
  auVar59 = pmulld(auVar14,local_1c8);
  auVar77 = pmulld(auVar76,local_b8);
  iVar6 = *(int *)((long)vert_filter_length_chroma + lVar8 + 0x1b0);
  uVar3 = *(undefined4 *)((long)vert_filter_length_chroma + lVar8 + 0x210);
  auVar31._4_4_ = uVar3;
  auVar31._0_4_ = uVar3;
  auVar31._8_4_ = uVar3;
  auVar31._12_4_ = uVar3;
  iVar12 = -iVar6;
  auVar70._4_4_ = iVar12;
  auVar70._0_4_ = iVar12;
  auVar70._8_4_ = iVar12;
  auVar70._12_4_ = iVar12;
  auVar71 = pmulld(auVar70,local_1b8);
  auVar79 = pmulld(local_638,auVar31);
  auVar15._4_4_ = iVar6;
  auVar15._0_4_ = iVar6;
  auVar15._8_4_ = iVar6;
  auVar15._12_4_ = iVar6;
  auVar32 = pmulld(auVar31,local_1b8);
  auVar61 = pmulld(auVar15,local_638);
  iVar6 = *(int *)((long)vert_filter_length_chroma + lVar8 + 400);
  iVar12 = -iVar6;
  auVar19._4_4_ = iVar12;
  auVar19._0_4_ = iVar12;
  auVar19._8_4_ = iVar12;
  auVar19._12_4_ = iVar12;
  iVar12 = -*(int *)((long)vert_filter_length_chroma + lVar8 + 0x230);
  auVar50._4_4_ = iVar12;
  auVar50._0_4_ = iVar12;
  auVar50._8_4_ = iVar12;
  auVar50._12_4_ = iVar12;
  auVar81 = pmulld(auVar19,local_148);
  auVar57 = pmulld(local_138,auVar50);
  auVar39._4_4_ = iVar6;
  auVar39._0_4_ = iVar6;
  auVar39._8_4_ = iVar6;
  auVar39._12_4_ = iVar6;
  auVar51 = pmulld(auVar50,local_148);
  auVar40 = pmulld(auVar39,local_138);
  iVar6 = *(int *)((long)vert_filter_length_chroma + lVar8 + 0x180);
  iVar12 = *(int *)((long)vert_filter_length_chroma + lVar8 + 0x240);
  auVar33._4_4_ = iVar12;
  auVar33._0_4_ = iVar12;
  auVar33._8_4_ = iVar12;
  auVar33._12_4_ = iVar12;
  iVar10 = -iVar6;
  auVar20._4_4_ = iVar10;
  auVar20._0_4_ = iVar10;
  auVar20._8_4_ = iVar10;
  auVar20._12_4_ = iVar10;
  auVar65 = pmulld(local_338,auVar20);
  auVar21 = pmulld(local_658,auVar33);
  auVar22._4_4_ = iVar6;
  auVar22._0_4_ = iVar6;
  auVar22._8_4_ = iVar6;
  auVar22._12_4_ = iVar6;
  auVar62 = pmulld(local_338,auVar33);
  auVar64 = pmulld(local_658,auVar22);
  iVar6 = *(int *)((long)vert_filter_length_chroma + lVar8 + 0x1c0);
  iVar10 = *(int *)((long)vert_filter_length_chroma + lVar8 + 0x200);
  iVar5 = -iVar6;
  auVar25._4_4_ = iVar5;
  auVar25._0_4_ = iVar5;
  auVar25._8_4_ = iVar5;
  auVar25._12_4_ = iVar5;
  iVar5 = -iVar10;
  auVar23._4_4_ = iVar5;
  auVar23._0_4_ = iVar5;
  auVar23._8_4_ = iVar5;
  auVar23._12_4_ = iVar5;
  auVar54._4_4_ = iStack_2c4;
  auVar54._0_4_ = local_2c8;
  auVar54._8_4_ = iStack_2c0;
  auVar54._12_4_ = iStack_2bc;
  auVar67 = pmulld(auVar54,auVar25);
  auVar49._4_4_ = iStack_2b4;
  auVar49._0_4_ = local_2b8;
  auVar49._8_4_ = iStack_2b0;
  auVar49._12_4_ = iStack_2ac;
  auVar52 = pmulld(auVar49,auVar23);
  auVar34._4_4_ = iVar6;
  auVar34._0_4_ = iVar6;
  auVar34._8_4_ = iVar6;
  auVar34._12_4_ = iVar6;
  local_648 = auVar55._0_4_;
  iStack_644 = auVar55._4_4_;
  uStack_640._0_4_ = auVar55._8_4_;
  uStack_640._4_4_ = auVar55._12_4_;
  local_348._0_8_ =
       CONCAT44(iStack_644 + (int)rnding[0] >> auVar82,local_648 + (int)rnding[0] >> auVar82);
  local_348._8_4_ = (int)uStack_640 + (int)rnding[0] >> auVar82;
  local_348._12_4_ = uStack_640._4_4_ + (int)rnding[0] >> auVar82;
  auVar54 = pmulld(auVar54,auVar23);
  auVar49 = pmulld(auVar49,auVar34);
  local_618 = auVar73._0_4_;
  iStack_614 = auVar73._4_4_;
  iStack_610 = auVar73._8_4_;
  iStack_60c = auVar73._12_4_;
  local_3b8._0_4_ = local_618 + (int)rnding[0] >> auVar82;
  local_3b8._4_4_ = iStack_614 + (int)rnding[0] >> auVar82;
  local_3b8._8_4_ = iStack_610 + (int)rnding[0] >> auVar82;
  local_3b8._12_4_ = iStack_60c + (int)rnding[0] >> auVar82;
  local_228._0_4_ = auVar69._0_4_ + (int)rnding[0] + auVar17._0_4_ >> auVar82;
  local_228._4_4_ = auVar69._4_4_ + (int)rnding[0] + auVar17._4_4_ >> auVar82;
  local_228._8_4_ = auVar69._8_4_ + (int)rnding[0] + auVar17._8_4_ >> auVar82;
  local_228._12_4_ = auVar69._12_4_ + (int)rnding[0] + auVar17._12_4_ >> auVar82;
  local_678._0_4_ = auVar56._0_4_ + (int)rnding[0] + auVar30._0_4_ >> auVar82;
  local_678._4_4_ = auVar56._4_4_ + (int)rnding[0] + auVar30._4_4_ >> auVar82;
  local_678._8_4_ = auVar56._8_4_ + (int)rnding[0] + auVar30._8_4_ >> auVar82;
  local_678._12_4_ = auVar56._12_4_ + (int)rnding[0] + auVar30._12_4_ >> auVar82;
  local_58 = local_678._0_4_;
  iStack_54 = local_678._4_4_;
  iStack_50 = local_678._8_4_;
  iStack_4c = local_678._12_4_;
  local_a8._0_4_ = auVar75._0_4_ + (int)rnding[0] + auVar38._0_4_ >> auVar82;
  local_a8._4_4_ = auVar75._4_4_ + (int)rnding[0] + auVar38._4_4_ >> auVar82;
  local_a8._8_4_ = auVar75._8_4_ + (int)rnding[0] + auVar38._8_4_ >> auVar82;
  local_a8._12_4_ = auVar75._12_4_ + (int)rnding[0] + auVar38._12_4_ >> auVar82;
  local_1d8 = auVar77._0_4_ + (int)rnding[0] + auVar59._0_4_ >> auVar82;
  iStack_1d4 = auVar77._4_4_ + (int)rnding[0] + auVar59._4_4_ >> auVar82;
  iStack_1d0 = auVar77._8_4_ + (int)rnding[0] + auVar59._8_4_ >> auVar82;
  iStack_1cc = auVar77._12_4_ + (int)rnding[0] + auVar59._12_4_ >> auVar82;
  local_1a8 = auVar71._0_4_ + (int)rnding[0] + auVar79._0_4_ >> auVar82;
  iStack_1a4 = auVar71._4_4_ + (int)rnding[0] + auVar79._4_4_ >> auVar82;
  iStack_1a0 = auVar71._8_4_ + (int)rnding[0] + auVar79._8_4_ >> auVar82;
  iStack_19c = auVar71._12_4_ + (int)rnding[0] + auVar79._12_4_ >> auVar82;
  local_d8 = auVar32._0_4_ + (int)rnding[0] + auVar61._0_4_ >> auVar82;
  iStack_d4 = auVar32._4_4_ + (int)rnding[0] + auVar61._4_4_ >> auVar82;
  iStack_d0 = auVar32._8_4_ + (int)rnding[0] + auVar61._8_4_ >> auVar82;
  iStack_cc = auVar32._12_4_ + (int)rnding[0] + auVar61._12_4_ >> auVar82;
  local_158 = auVar57._0_4_ + (int)rnding[0] + auVar81._0_4_ >> auVar82;
  iStack_154 = auVar57._4_4_ + (int)rnding[0] + auVar81._4_4_ >> auVar82;
  iStack_150 = auVar57._8_4_ + (int)rnding[0] + auVar81._8_4_ >> auVar82;
  iStack_14c = auVar57._12_4_ + (int)rnding[0] + auVar81._12_4_ >> auVar82;
  local_128 = auVar40._0_4_ + (int)rnding[0] + auVar51._0_4_ >> auVar82;
  iStack_124 = auVar40._4_4_ + (int)rnding[0] + auVar51._4_4_ >> auVar82;
  iStack_120 = auVar40._8_4_ + (int)rnding[0] + auVar51._8_4_ >> auVar82;
  iStack_11c = auVar40._12_4_ + (int)rnding[0] + auVar51._12_4_ >> auVar82;
  local_328 = auVar65._0_4_ + (int)rnding[0] + auVar21._0_4_ >> auVar82;
  iStack_324 = auVar65._4_4_ + (int)rnding[0] + auVar21._4_4_ >> auVar82;
  iStack_320 = auVar65._8_4_ + (int)rnding[0] + auVar21._8_4_ >> auVar82;
  iStack_31c = auVar65._12_4_ + (int)rnding[0] + auVar21._12_4_ >> auVar82;
  local_258 = auVar62._0_4_ + (int)rnding[0] + auVar64._0_4_ >> auVar82;
  iStack_254 = auVar62._4_4_ + (int)rnding[0] + auVar64._4_4_ >> auVar82;
  iStack_250 = auVar62._8_4_ + (int)rnding[0] + auVar64._8_4_ >> auVar82;
  iStack_24c = auVar62._12_4_ + (int)rnding[0] + auVar64._12_4_ >> auVar82;
  local_2d8 = auVar52._0_4_ + (int)rnding[0] + auVar67._0_4_ >> auVar82;
  iStack_2d4 = auVar52._4_4_ + (int)rnding[0] + auVar67._4_4_ >> auVar82;
  iStack_2d0 = auVar52._8_4_ + (int)rnding[0] + auVar67._8_4_ >> auVar82;
  iStack_2cc = auVar52._12_4_ + (int)rnding[0] + auVar67._12_4_ >> auVar82;
  local_2a8 = auVar49._0_4_ + (int)rnding[0] + auVar54._0_4_ >> auVar82;
  iStack_2a4 = auVar49._4_4_ + (int)rnding[0] + auVar54._4_4_ >> auVar82;
  iStack_2a0 = auVar49._8_4_ + (int)rnding[0] + auVar54._8_4_ >> auVar82;
  iStack_29c = auVar49._12_4_ + (int)rnding[0] + auVar54._12_4_ >> auVar82;
  auVar61._4_4_ = (int)cospim16[0];
  auVar61._0_4_ = (int)cospim16[0];
  auVar61._8_4_ = (int)cospim16[0];
  auVar61._12_4_ = (int)cospim16[0];
  auVar54 = pmulld(local_3b8,auVar61);
  auVar64._4_4_ = (int)cospi48[0];
  auVar64._0_4_ = (int)cospi48[0];
  auVar64._8_4_ = (int)cospi48[0];
  auVar64._12_4_ = (int)cospi48[0];
  auVar38 = pmulld(local_348,auVar64);
  auVar59 = pmulld(auVar64,local_3b8);
  auVar67._4_4_ = (int)cospi16[0];
  auVar67._0_4_ = (int)cospi16[0];
  auVar67._8_4_ = (int)cospi16[0];
  auVar67._12_4_ = (int)cospi16[0];
  auVar49 = pmulld(auVar67,local_348);
  auVar17._12_4_ = local_438[3];
  auVar17._0_12_ = *(undefined1 (*) [12])*in;
  auVar30._4_4_ = (int)cospi32[0];
  auVar30._0_4_ = (int)cospi32[0];
  auVar30._8_4_ = (int)cospi32[0];
  auVar30._12_4_ = (int)cospi32[0];
  auVar30 = pmulld(auVar17,auVar30);
  local_428 = auVar30._0_4_ + (int)rnding[0] >> auVar82;
  iStack_424 = auVar30._4_4_ + (int)rnding[0] >> auVar82;
  iStack_420 = auVar30._8_4_ + (int)rnding[0] >> auVar82;
  iStack_41c = auVar30._12_4_ + (int)rnding[0] >> auVar82;
  local_3a8 = auVar54._0_4_ + (int)rnding[0] + auVar38._0_4_ >> auVar82;
  iStack_3a4 = auVar54._4_4_ + (int)rnding[0] + auVar38._4_4_ >> auVar82;
  iStack_3a0 = auVar54._8_4_ + (int)rnding[0] + auVar38._8_4_ >> auVar82;
  iStack_39c = auVar54._12_4_ + (int)rnding[0] + auVar38._12_4_ >> auVar82;
  local_358 = auVar59._0_4_ + (int)rnding[0] + auVar49._0_4_ >> auVar82;
  iStack_354 = auVar59._4_4_ + (int)rnding[0] + auVar49._4_4_ >> auVar82;
  iStack_350 = auVar59._8_4_ + (int)rnding[0] + auVar49._8_4_ >> auVar82;
  iStack_34c = auVar59._12_4_ + (int)rnding[0] + auVar49._12_4_ >> auVar82;
  local_438[0] = local_428;
  local_438[1] = iStack_424;
  local_438[2] = iStack_420;
  local_438[3] = iStack_41c;
  auVar30 = pmulld(local_228,auVar20);
  auVar38 = pmulld(local_678,auVar33);
  auVar49 = pmulld(local_228,auVar33);
  auVar54 = pmulld(local_678,auVar22);
  local_68 = auVar49._0_4_ + (int)rnding[0] + auVar54._0_4_ >> auVar82;
  iStack_64 = auVar49._4_4_ + (int)rnding[0] + auVar54._4_4_ >> auVar82;
  iStack_60 = auVar49._8_4_ + (int)rnding[0] + auVar54._8_4_ >> auVar82;
  iStack_5c = auVar49._12_4_ + (int)rnding[0] + auVar54._12_4_ >> auVar82;
  local_218 = auVar30._0_4_ + (int)rnding[0] + auVar38._0_4_ >> auVar82;
  iStack_214 = auVar30._4_4_ + (int)rnding[0] + auVar38._4_4_ >> auVar82;
  iStack_210 = auVar30._8_4_ + (int)rnding[0] + auVar38._8_4_ >> auVar82;
  iStack_20c = auVar30._12_4_ + (int)rnding[0] + auVar38._12_4_ >> auVar82;
  auVar30 = pmulld(local_238,auVar20);
  auVar38 = pmulld(local_48,auVar33);
  auVar54 = pmulld(local_48,auVar22);
  auVar49 = pmulld(local_238,auVar33);
  local_78 = auVar49._0_4_ + (int)rnding[0] + auVar54._0_4_ >> auVar82;
  iStack_74 = auVar49._4_4_ + (int)rnding[0] + auVar54._4_4_ >> auVar82;
  iStack_70 = auVar49._8_4_ + (int)rnding[0] + auVar54._8_4_ >> auVar82;
  iStack_6c = auVar49._12_4_ + (int)rnding[0] + auVar54._12_4_ >> auVar82;
  local_208 = auVar30._0_4_ + (int)rnding[0] + auVar38._0_4_ >> auVar82;
  iStack_204 = auVar30._4_4_ + (int)rnding[0] + auVar38._4_4_ >> auVar82;
  iStack_200 = auVar30._8_4_ + (int)rnding[0] + auVar38._8_4_ >> auVar82;
  iStack_1fc = auVar30._12_4_ + (int)rnding[0] + auVar38._12_4_ >> auVar82;
  iVar12 = -iVar12;
  auVar16._4_4_ = iVar12;
  auVar16._0_4_ = iVar12;
  auVar16._8_4_ = iVar12;
  auVar16._12_4_ = iVar12;
  auVar30 = pmulld(local_1c8,auVar16);
  auVar49 = pmulld(local_b8,auVar20);
  auVar54 = pmulld(local_1c8,auVar20);
  auVar38 = pmulld(local_b8,auVar33);
  local_88 = auVar38._0_4_ + (int)rnding[0] + auVar54._0_4_ >> auVar82;
  iStack_84 = auVar38._4_4_ + (int)rnding[0] + auVar54._4_4_ >> auVar82;
  iStack_80 = auVar38._8_4_ + (int)rnding[0] + auVar54._8_4_ >> auVar82;
  iStack_7c = auVar38._12_4_ + (int)rnding[0] + auVar54._12_4_ >> auVar82;
  local_1f8 = auVar49._0_4_ + (int)rnding[0] + auVar30._0_4_ >> auVar82;
  iStack_1f4 = auVar49._4_4_ + (int)rnding[0] + auVar30._4_4_ >> auVar82;
  iStack_1f0 = auVar49._8_4_ + (int)rnding[0] + auVar30._8_4_ >> auVar82;
  iStack_1ec = auVar49._12_4_ + (int)rnding[0] + auVar30._12_4_ >> auVar82;
  auVar52._4_4_ = iStack_1d4;
  auVar52._0_4_ = local_1d8;
  auVar52._8_4_ = iStack_1d0;
  auVar52._12_4_ = iStack_1cc;
  auVar30 = pmulld(auVar16,auVar52);
  auVar49 = pmulld(local_a8,auVar20);
  auVar38 = pmulld(auVar52,auVar20);
  auVar54 = pmulld(local_a8,auVar33);
  local_98 = auVar38._0_4_ + (int)rnding[0] + auVar54._0_4_ >> auVar82;
  iStack_94 = auVar38._4_4_ + (int)rnding[0] + auVar54._4_4_ >> auVar82;
  iStack_90 = auVar38._8_4_ + (int)rnding[0] + auVar54._8_4_ >> auVar82;
  iStack_8c = auVar38._12_4_ + (int)rnding[0] + auVar54._12_4_ >> auVar82;
  local_1e8 = auVar30._0_4_ + (int)rnding[0] + auVar49._0_4_ >> auVar82;
  iStack_1e4 = auVar30._4_4_ + (int)rnding[0] + auVar49._4_4_ >> auVar82;
  iStack_1e0 = auVar30._8_4_ + (int)rnding[0] + auVar49._8_4_ >> auVar82;
  iStack_1dc = auVar30._12_4_ + (int)rnding[0] + auVar49._12_4_ >> auVar82;
  auVar55._4_4_ = iStack_1a4;
  auVar55._0_4_ = local_1a8;
  auVar55._8_4_ = iStack_1a0;
  auVar55._12_4_ = iStack_19c;
  auVar49 = pmulld(auVar55,auVar23);
  auVar38._4_4_ = iStack_d4;
  auVar38._0_4_ = local_d8;
  auVar38._8_4_ = iStack_d0;
  auVar38._12_4_ = iStack_cc;
  auVar54 = pmulld(auVar38,auVar34);
  auVar41._4_4_ = iVar10;
  auVar41._0_4_ = iVar10;
  auVar41._8_4_ = iVar10;
  auVar41._12_4_ = iVar10;
  auVar30 = pmulld(auVar55,auVar34);
  auVar38 = pmulld(auVar38,auVar41);
  local_e8 = auVar30._0_4_ + (int)rnding[0] + auVar38._0_4_ >> auVar82;
  iStack_e4 = auVar30._4_4_ + (int)rnding[0] + auVar38._4_4_ >> auVar82;
  iStack_e0 = auVar30._8_4_ + (int)rnding[0] + auVar38._8_4_ >> auVar82;
  iStack_dc = auVar30._12_4_ + (int)rnding[0] + auVar38._12_4_ >> auVar82;
  local_198 = auVar49._0_4_ + (int)rnding[0] + auVar54._0_4_ >> auVar82;
  iStack_194 = auVar49._4_4_ + (int)rnding[0] + auVar54._4_4_ >> auVar82;
  iStack_190 = auVar49._8_4_ + (int)rnding[0] + auVar54._8_4_ >> auVar82;
  iStack_18c = auVar49._12_4_ + (int)rnding[0] + auVar54._12_4_ >> auVar82;
  auVar56._8_4_ = local_1b8._8_4_;
  auVar56._0_8_ = local_1b8._0_8_;
  auVar56._12_4_ = local_1b8._12_4_;
  auVar38 = pmulld(auVar56,auVar23);
  auVar71._8_4_ = local_638._8_4_;
  auVar71._0_8_ = local_638._0_8_;
  auVar71._12_4_ = local_638._12_4_;
  auVar54 = pmulld(auVar71,auVar34);
  auVar49 = pmulld(auVar71,auVar41);
  auVar30 = pmulld(auVar56,auVar34);
  local_f8 = auVar30._0_4_ + (int)rnding[0] + auVar49._0_4_ >> auVar82;
  iStack_f4 = auVar30._4_4_ + (int)rnding[0] + auVar49._4_4_ >> auVar82;
  iStack_f0 = auVar30._8_4_ + (int)rnding[0] + auVar49._8_4_ >> auVar82;
  iStack_ec = auVar30._12_4_ + (int)rnding[0] + auVar49._12_4_ >> auVar82;
  local_188 = auVar54._0_4_ + (int)rnding[0] + auVar38._0_4_ >> auVar82;
  iStack_184 = auVar54._4_4_ + (int)rnding[0] + auVar38._4_4_ >> auVar82;
  iStack_180 = auVar54._8_4_ + (int)rnding[0] + auVar38._8_4_ >> auVar82;
  iStack_17c = auVar54._12_4_ + (int)rnding[0] + auVar38._12_4_ >> auVar82;
  auVar57._8_4_ = local_148._8_4_;
  auVar57._0_8_ = local_148._0_8_;
  auVar57._12_4_ = local_148._12_4_;
  auVar69._8_4_ = local_138._8_4_;
  auVar69._0_8_ = local_138._0_8_;
  auVar69._12_4_ = local_138._12_4_;
  auVar49 = pmulld(auVar57,auVar25);
  auVar54 = pmulld(auVar69,auVar23);
  auVar30 = pmulld(auVar57,auVar23);
  auVar38 = pmulld(auVar69,auVar34);
  local_108 = auVar38._0_4_ + (int)rnding[0] + auVar30._0_4_ >> auVar82;
  iStack_104 = auVar38._4_4_ + (int)rnding[0] + auVar30._4_4_ >> auVar82;
  iStack_100 = auVar38._8_4_ + (int)rnding[0] + auVar30._8_4_ >> auVar82;
  iStack_fc = auVar38._12_4_ + (int)rnding[0] + auVar30._12_4_ >> auVar82;
  local_178 = auVar49._0_4_ + (int)rnding[0] + auVar54._0_4_ >> auVar82;
  iStack_174 = auVar49._4_4_ + (int)rnding[0] + auVar54._4_4_ >> auVar82;
  iStack_170 = auVar49._8_4_ + (int)rnding[0] + auVar54._8_4_ >> auVar82;
  iStack_16c = auVar49._12_4_ + (int)rnding[0] + auVar54._12_4_ >> auVar82;
  auVar62._4_4_ = iStack_154;
  auVar62._0_4_ = local_158;
  auVar62._8_4_ = iStack_150;
  auVar62._12_4_ = iStack_14c;
  auVar65._4_4_ = iStack_124;
  auVar65._0_4_ = local_128;
  auVar65._8_4_ = iStack_120;
  auVar65._12_4_ = iStack_11c;
  auVar54 = pmulld(auVar25,auVar62);
  auVar49 = pmulld(auVar65,auVar23);
  auVar30 = pmulld(auVar62,auVar23);
  auVar38 = pmulld(auVar65,auVar34);
  local_118 = auVar38._0_4_ + (int)rnding[0] + auVar30._0_4_ >> auVar82;
  iStack_114 = auVar38._4_4_ + (int)rnding[0] + auVar30._4_4_ >> auVar82;
  iStack_110 = auVar38._8_4_ + (int)rnding[0] + auVar30._8_4_ >> auVar82;
  iStack_10c = auVar38._12_4_ + (int)rnding[0] + auVar30._12_4_ >> auVar82;
  local_168 = auVar54._0_4_ + (int)rnding[0] + auVar49._0_4_ >> auVar82;
  iStack_164 = auVar54._4_4_ + (int)rnding[0] + auVar49._4_4_ >> auVar82;
  iStack_160 = auVar54._8_4_ + (int)rnding[0] + auVar49._8_4_ >> auVar82;
  iStack_15c = auVar54._12_4_ + (int)rnding[0] + auVar49._12_4_ >> auVar82;
  local_408 = local_428;
  iStack_404 = iStack_424;
  iStack_400 = iStack_420;
  iStack_3fc = iStack_41c;
  local_418 = local_428;
  iStack_414 = iStack_424;
  iStack_410 = iStack_420;
  iStack_40c = iStack_41c;
  local_388 = local_3b8;
  local_398 = local_3a8;
  iStack_394 = iStack_3a4;
  iStack_390 = iStack_3a0;
  iStack_38c = iStack_39c;
  uStack_640 = local_348._8_8_;
  local_378 = local_348._0_8_;
  uStack_370 = uStack_640;
  local_368 = local_358;
  iStack_364 = iStack_354;
  iStack_360 = iStack_350;
  iStack_35c = iStack_34c;
  auVar73._4_4_ = iStack_324;
  auVar73._0_4_ = local_328;
  auVar73._8_4_ = iStack_320;
  auVar73._12_4_ = iStack_31c;
  auVar51._4_4_ = iStack_254;
  auVar51._0_4_ = local_258;
  auVar51._8_4_ = iStack_250;
  auVar51._12_4_ = iStack_24c;
  auVar49 = pmulld(auVar73,auVar61);
  auVar54 = pmulld(auVar51,auVar64);
  auVar30 = pmulld(auVar73,auVar64);
  auVar38 = pmulld(auVar51,auVar67);
  local_268 = auVar30._0_4_ + (int)rnding[0] + auVar38._0_4_ >> auVar82;
  iStack_264 = auVar30._4_4_ + (int)rnding[0] + auVar38._4_4_ >> auVar82;
  iStack_260 = auVar30._8_4_ + (int)rnding[0] + auVar38._8_4_ >> auVar82;
  iStack_25c = auVar30._12_4_ + (int)rnding[0] + auVar38._12_4_ >> auVar82;
  local_318 = auVar49._0_4_ + (int)rnding[0] + auVar54._0_4_ >> auVar82;
  iStack_314 = auVar49._4_4_ + (int)rnding[0] + auVar54._4_4_ >> auVar82;
  iStack_310 = auVar49._8_4_ + (int)rnding[0] + auVar54._8_4_ >> auVar82;
  iStack_30c = auVar49._12_4_ + (int)rnding[0] + auVar54._12_4_ >> auVar82;
  auVar75._8_4_ = local_338._8_4_;
  auVar75._0_8_ = local_338._0_8_;
  auVar75._12_4_ = local_338._12_4_;
  auVar40._8_4_ = local_658._8_4_;
  auVar40._0_8_ = local_658._0_8_;
  auVar40._12_4_ = local_658._12_4_;
  auVar49 = pmulld(auVar75,auVar61);
  auVar54 = pmulld(auVar40,auVar64);
  auVar30 = pmulld(auVar75,auVar64);
  auVar38 = pmulld(auVar40,auVar67);
  local_278 = auVar30._0_4_ + (int)rnding[0] + auVar38._0_4_ >> auVar82;
  iStack_274 = auVar30._4_4_ + (int)rnding[0] + auVar38._4_4_ >> auVar82;
  iStack_270 = auVar30._8_4_ + (int)rnding[0] + auVar38._8_4_ >> auVar82;
  iStack_26c = auVar30._12_4_ + (int)rnding[0] + auVar38._12_4_ >> auVar82;
  local_308 = auVar49._0_4_ + (int)rnding[0] + auVar54._0_4_ >> auVar82;
  iStack_304 = auVar49._4_4_ + (int)rnding[0] + auVar54._4_4_ >> auVar82;
  iStack_300 = auVar49._8_4_ + (int)rnding[0] + auVar54._8_4_ >> auVar82;
  iStack_2fc = auVar49._12_4_ + (int)rnding[0] + auVar54._12_4_ >> auVar82;
  auVar59._4_4_ = (int)cospim48[0];
  auVar59._0_4_ = (int)cospim48[0];
  auVar59._8_4_ = (int)cospim48[0];
  auVar59._12_4_ = (int)cospim48[0];
  auVar79._4_4_ = iStack_2c4;
  auVar79._0_4_ = local_2c8;
  auVar79._8_4_ = iStack_2c0;
  auVar79._12_4_ = iStack_2bc;
  auVar32._4_4_ = iStack_2b4;
  auVar32._0_4_ = local_2b8;
  auVar32._8_4_ = iStack_2b0;
  auVar32._12_4_ = iStack_2ac;
  auVar49 = pmulld(auVar79,auVar59);
  auVar54 = pmulld(auVar32,auVar61);
  auVar30 = pmulld(auVar79,auVar61);
  auVar38 = pmulld(auVar32,auVar64);
  local_288 = auVar30._0_4_ + (int)rnding[0] + auVar38._0_4_ >> auVar82;
  iStack_284 = auVar30._4_4_ + (int)rnding[0] + auVar38._4_4_ >> auVar82;
  iStack_280 = auVar30._8_4_ + (int)rnding[0] + auVar38._8_4_ >> auVar82;
  iStack_27c = auVar30._12_4_ + (int)rnding[0] + auVar38._12_4_ >> auVar82;
  local_2f8 = auVar49._0_4_ + (int)rnding[0] + auVar54._0_4_ >> auVar82;
  iStack_2f4 = auVar49._4_4_ + (int)rnding[0] + auVar54._4_4_ >> auVar82;
  iStack_2f0 = auVar49._8_4_ + (int)rnding[0] + auVar54._8_4_ >> auVar82;
  iStack_2ec = auVar49._12_4_ + (int)rnding[0] + auVar54._12_4_ >> auVar82;
  auVar81._4_4_ = iStack_2d4;
  auVar81._0_4_ = local_2d8;
  auVar81._8_4_ = iStack_2d0;
  auVar81._12_4_ = iStack_2cc;
  auVar21._4_4_ = iStack_2a4;
  auVar21._0_4_ = local_2a8;
  auVar21._8_4_ = iStack_2a0;
  auVar21._12_4_ = iStack_29c;
  auVar30 = pmulld(auVar59,auVar81);
  auVar54 = pmulld(auVar21,auVar61);
  auVar38 = pmulld(auVar81,auVar61);
  auVar49 = pmulld(auVar21,auVar64);
  local_298 = auVar38._0_4_ + (int)rnding[0] + auVar49._0_4_ >> auVar82;
  iStack_294 = auVar38._4_4_ + (int)rnding[0] + auVar49._4_4_ >> auVar82;
  iStack_290 = auVar38._8_4_ + (int)rnding[0] + auVar49._8_4_ >> auVar82;
  iStack_28c = auVar38._12_4_ + (int)rnding[0] + auVar49._12_4_ >> auVar82;
  local_2e8 = auVar30._0_4_ + (int)rnding[0] + auVar54._0_4_ >> auVar82;
  iStack_2e4 = auVar30._4_4_ + (int)rnding[0] + auVar54._4_4_ >> auVar82;
  iStack_2e0 = auVar30._8_4_ + (int)rnding[0] + auVar54._8_4_ >> auVar82;
  iStack_2dc = auVar30._12_4_ + (int)rnding[0] + auVar54._12_4_ >> auVar82;
  for (uVar7 = 0x20; (uVar7 & 0xffffffc0) == 0; uVar7 = uVar7 + 0x10) {
    uVar9 = uVar7;
    for (lVar8 = 0; lVar8 != 0x40; lVar8 = lVar8 + 0x10) {
      piVar1 = (int *)(puVar4 + lVar8);
      uVar11 = uVar9 ^ 7;
      iVar35 = local_438[uVar11 * 4] + *piVar1;
      iVar42 = local_438[uVar11 * 4 + 1] + piVar1[1];
      iVar44 = local_438[uVar11 * 4 + 2] + piVar1[2];
      iVar46 = local_438[uVar11 * 4 + 3] + piVar1[3];
      iVar6 = *piVar1 - local_438[uVar11 * 4];
      iVar12 = piVar1[1] - local_438[uVar11 * 4 + 1];
      iVar10 = piVar1[2] - local_438[uVar11 * 4 + 2];
      iVar5 = piVar1[3] - local_438[uVar11 * 4 + 3];
      uVar36 = (uint)(iVar35 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
               (uint)(iVar35 >= (int)clamp_lo[0]) * iVar35;
      uVar43 = (uint)(iVar42 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
               (uint)(iVar42 >= (int)clamp_lo[0]) * iVar42;
      uVar45 = (uint)(iVar44 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
               (uint)(iVar44 >= (int)clamp_lo[0]) * iVar44;
      uVar47 = (uint)(iVar46 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
               (uint)(iVar46 >= (int)clamp_lo[0]) * iVar46;
      uVar24 = (uint)(iVar6 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
               (uint)(iVar6 >= (int)clamp_lo[0]) * iVar6;
      uVar26 = (uint)(iVar12 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
               (uint)(iVar12 >= (int)clamp_lo[0]) * iVar12;
      uVar27 = (uint)(iVar10 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
               (uint)(iVar10 >= (int)clamp_lo[0]) * iVar10;
      uVar28 = (uint)(iVar5 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
               (uint)(iVar5 >= (int)clamp_lo[0]) * iVar5;
      puVar2 = (uint *)(puVar4 + lVar8);
      *puVar2 = (uint)((int)clamp_hi[0] < (int)uVar36) * (int)clamp_hi[0] |
                ((int)clamp_hi[0] >= (int)uVar36) * uVar36;
      puVar2[1] = (uint)((int)clamp_hi[0] < (int)uVar43) * (int)clamp_hi[0] |
                  ((int)clamp_hi[0] >= (int)uVar43) * uVar43;
      puVar2[2] = (uint)((int)clamp_hi[0] < (int)uVar45) * (int)clamp_hi[0] |
                  ((int)clamp_hi[0] >= (int)uVar45) * uVar45;
      puVar2[3] = (uint)((int)clamp_hi[0] < (int)uVar47) * (int)clamp_hi[0] |
                  ((int)clamp_hi[0] >= (int)uVar47) * uVar47;
      local_438[uVar11 * 4] =
           (uint)((int)clamp_hi[0] < (int)uVar24) * (int)clamp_hi[0] |
           ((int)clamp_hi[0] >= (int)uVar24) * uVar24;
      local_438[uVar11 * 4 + 1] =
           (uint)((int)clamp_hi[0] < (int)uVar26) * (int)clamp_hi[0] |
           ((int)clamp_hi[0] >= (int)uVar26) * uVar26;
      local_438[uVar11 * 4 + 2] =
           (uint)((int)clamp_hi[0] < (int)uVar27) * (int)clamp_hi[0] |
           ((int)clamp_hi[0] >= (int)uVar27) * uVar27;
      local_438[uVar11 * 4 + 3] =
           (uint)((int)clamp_hi[0] < (int)uVar28) * (int)clamp_hi[0] |
           ((int)clamp_hi[0] >= (int)uVar28) * uVar28;
      uVar11 = uVar9 ^ 0xf;
      auVar82 = *(undefined1 (*) [16])(local_438 + (uVar9 ^ 8) * 4);
      iVar35 = auVar82._0_4_ + local_438[uVar11 * 4];
      iVar42 = auVar82._4_4_ + local_438[uVar11 * 4 + 1];
      iVar44 = auVar82._8_4_ + local_438[uVar11 * 4 + 2];
      iVar46 = auVar82._12_4_ + local_438[uVar11 * 4 + 3];
      iVar6 = local_438[uVar11 * 4] - auVar82._0_4_;
      iVar12 = local_438[uVar11 * 4 + 1] - auVar82._4_4_;
      iVar10 = local_438[uVar11 * 4 + 2] - auVar82._8_4_;
      iVar5 = local_438[uVar11 * 4 + 3] - auVar82._12_4_;
      uVar36 = (uint)(iVar35 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
               (uint)(iVar35 >= (int)clamp_lo[0]) * iVar35;
      uVar43 = (uint)(iVar42 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
               (uint)(iVar42 >= (int)clamp_lo[0]) * iVar42;
      uVar45 = (uint)(iVar44 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
               (uint)(iVar44 >= (int)clamp_lo[0]) * iVar44;
      uVar47 = (uint)(iVar46 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
               (uint)(iVar46 >= (int)clamp_lo[0]) * iVar46;
      uVar24 = (uint)(iVar6 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
               (uint)(iVar6 >= (int)clamp_lo[0]) * iVar6;
      uVar26 = (uint)(iVar12 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
               (uint)(iVar12 >= (int)clamp_lo[0]) * iVar12;
      uVar27 = (uint)(iVar10 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
               (uint)(iVar10 >= (int)clamp_lo[0]) * iVar10;
      uVar28 = (uint)(iVar5 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
               (uint)(iVar5 >= (int)clamp_lo[0]) * iVar5;
      auVar82._0_4_ =
           (uint)((int)clamp_hi[0] < (int)uVar24) * (int)clamp_hi[0] |
           ((int)clamp_hi[0] >= (int)uVar24) * uVar24;
      auVar82._4_4_ =
           (uint)((int)clamp_hi[0] < (int)uVar26) * (int)clamp_hi[0] |
           ((int)clamp_hi[0] >= (int)uVar26) * uVar26;
      auVar82._8_4_ =
           (uint)((int)clamp_hi[0] < (int)uVar27) * (int)clamp_hi[0] |
           ((int)clamp_hi[0] >= (int)uVar27) * uVar27;
      auVar82._12_4_ =
           (uint)((int)clamp_hi[0] < (int)uVar28) * (int)clamp_hi[0] |
           ((int)clamp_hi[0] >= (int)uVar28) * uVar28;
      local_438[uVar11 * 4] =
           (uint)((int)clamp_hi[0] < (int)uVar36) * (int)clamp_hi[0] |
           ((int)clamp_hi[0] >= (int)uVar36) * uVar36;
      local_438[uVar11 * 4 + 1] =
           (uint)((int)clamp_hi[0] < (int)uVar43) * (int)clamp_hi[0] |
           ((int)clamp_hi[0] >= (int)uVar43) * uVar43;
      local_438[uVar11 * 4 + 2] =
           (uint)((int)clamp_hi[0] < (int)uVar45) * (int)clamp_hi[0] |
           ((int)clamp_hi[0] >= (int)uVar45) * uVar45;
      local_438[uVar11 * 4 + 3] =
           (uint)((int)clamp_hi[0] < (int)uVar47) * (int)clamp_hi[0] |
           ((int)clamp_hi[0] >= (int)uVar47) * uVar47;
      *(undefined1 (*) [16])(local_438 + (uVar9 ^ 8) * 4) = auVar82;
      uVar9 = uVar9 + 1;
    }
    puVar4 = puVar4 + 0x100;
  }
  local_3c8 = CONCAT44(local_438[1],local_438[0]);
  uStack_3c0 = CONCAT44(local_438[3],local_438[2]);
  local_3d8 = CONCAT44(iStack_424,local_428);
  uStack_3d0 = CONCAT44(iStack_41c,iStack_420);
  local_3e8 = CONCAT44(iStack_414,local_418);
  uStack_3e0 = CONCAT44(iStack_40c,iStack_410);
  local_3f8 = CONCAT44(iStack_404,local_408);
  uStack_3f0 = CONCAT44(iStack_3fc,iStack_400);
  cospi32[0]._4_4_ = (int)cospi32[0];
  cospi32[1]._0_4_ = (int)cospi32[0];
  cospi32[1]._4_4_ = (int)cospi32[0];
  cospim48[0]._4_4_ = (int)cospim48[0];
  cospim48[1]._0_4_ = (int)cospim48[0];
  cospim48[1]._4_4_ = (int)cospim48[0];
  cospim16[0]._4_4_ = (int)cospim16[0];
  cospim16[1]._0_4_ = (int)cospim16[0];
  cospim16[1]._4_4_ = (int)cospim16[0];
  cospi48[0]._4_4_ = (int)cospi48[0];
  cospi48[1]._0_4_ = (int)cospi48[0];
  cospi48[1]._4_4_ = (int)cospi48[0];
  cospi16[0]._4_4_ = (int)cospi16[0];
  cospi16[1]._0_4_ = (int)cospi16[0];
  cospi16[1]._4_4_ = (int)cospi16[0];
  clamp_hi[0]._4_4_ = (int)clamp_hi[0];
  clamp_hi[1]._0_4_ = (int)clamp_hi[0];
  clamp_hi[1]._4_4_ = (int)clamp_hi[0];
  clamp_lo[0]._4_4_ = (int)clamp_lo[0];
  clamp_lo[1]._0_4_ = (int)clamp_lo[0];
  clamp_lo[1]._4_4_ = (int)clamp_lo[0];
  rnding[0]._4_4_ = (int)rnding[0];
  rnding[1]._0_4_ = (int)rnding[0];
  rnding[1]._4_4_ = (int)rnding[0];
  cospim32[0]._4_4_ = (int)cospim32[0];
  cospim32[1]._0_4_ = (int)cospim32[0];
  cospim32[1]._4_4_ = (int)cospim32[0];
  idct64_stage8_sse4_1
            ((__m128i *)local_438,&cospim32,&cospi32,&cospim16,&cospi48,&cospi16,&cospim48,&clamp_lo
             ,&clamp_hi,&rnding,bit);
  idct64_stage9_sse4_1((__m128i *)local_438,&cospim32,&cospi32,&clamp_lo,&clamp_hi,&rnding,bit);
  idct64_stage10_sse4_1((__m128i *)local_438,&cospim32,&cospi32,&clamp_lo,&clamp_hi,&rnding,bit);
  idct64_stage11_sse4_1((__m128i *)local_438,out,do_cols,bd,out_shift,&clamp_lo,&clamp_hi);
  return;
}

Assistant:

static void idct64x64_low8_sse4_1(__m128i *in, __m128i *out, int bit,
                                  int do_cols, int bd, int out_shift) {
  int i, j;
  const int32_t *cospi = cospi_arr(bit);
  const __m128i rnding = _mm_set1_epi32(1 << (bit - 1));
  const int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  const __m128i clamp_lo = _mm_set1_epi32(-(1 << (log_range - 1)));
  const __m128i clamp_hi = _mm_set1_epi32((1 << (log_range - 1)) - 1);

  const __m128i cospi1 = _mm_set1_epi32(cospi[1]);
  const __m128i cospi2 = _mm_set1_epi32(cospi[2]);
  const __m128i cospi3 = _mm_set1_epi32(cospi[3]);
  const __m128i cospi4 = _mm_set1_epi32(cospi[4]);
  const __m128i cospi6 = _mm_set1_epi32(cospi[6]);
  const __m128i cospi8 = _mm_set1_epi32(cospi[8]);
  const __m128i cospi12 = _mm_set1_epi32(cospi[12]);
  const __m128i cospi16 = _mm_set1_epi32(cospi[16]);
  const __m128i cospi20 = _mm_set1_epi32(cospi[20]);
  const __m128i cospi24 = _mm_set1_epi32(cospi[24]);
  const __m128i cospi28 = _mm_set1_epi32(cospi[28]);
  const __m128i cospi32 = _mm_set1_epi32(cospi[32]);
  const __m128i cospi40 = _mm_set1_epi32(cospi[40]);
  const __m128i cospi44 = _mm_set1_epi32(cospi[44]);
  const __m128i cospi48 = _mm_set1_epi32(cospi[48]);
  const __m128i cospi56 = _mm_set1_epi32(cospi[56]);
  const __m128i cospi60 = _mm_set1_epi32(cospi[60]);
  const __m128i cospim4 = _mm_set1_epi32(-cospi[4]);
  const __m128i cospim8 = _mm_set1_epi32(-cospi[8]);
  const __m128i cospim12 = _mm_set1_epi32(-cospi[12]);
  const __m128i cospim16 = _mm_set1_epi32(-cospi[16]);
  const __m128i cospim20 = _mm_set1_epi32(-cospi[20]);
  const __m128i cospim24 = _mm_set1_epi32(-cospi[24]);
  const __m128i cospim28 = _mm_set1_epi32(-cospi[28]);
  const __m128i cospim32 = _mm_set1_epi32(-cospi[32]);
  const __m128i cospim36 = _mm_set1_epi32(-cospi[36]);
  const __m128i cospim40 = _mm_set1_epi32(-cospi[40]);
  const __m128i cospim48 = _mm_set1_epi32(-cospi[48]);
  const __m128i cospim52 = _mm_set1_epi32(-cospi[52]);
  const __m128i cospim56 = _mm_set1_epi32(-cospi[56]);
  const __m128i cospi63 = _mm_set1_epi32(cospi[63]);
  const __m128i cospim57 = _mm_set1_epi32(-cospi[57]);
  const __m128i cospi7 = _mm_set1_epi32(cospi[7]);
  const __m128i cospi5 = _mm_set1_epi32(cospi[5]);
  const __m128i cospi59 = _mm_set1_epi32(cospi[59]);
  const __m128i cospim61 = _mm_set1_epi32(-cospi[61]);
  const __m128i cospim58 = _mm_set1_epi32(-cospi[58]);
  const __m128i cospi62 = _mm_set1_epi32(cospi[62]);

  {
    __m128i u[64];

    // stage 1
    u[0] = in[0];
    u[8] = in[4];
    u[16] = in[2];
    u[24] = in[6];
    u[32] = in[1];
    u[40] = in[5];
    u[48] = in[3];
    u[56] = in[7];

    // stage 2
    u[63] = half_btf_0_sse4_1(&cospi1, &u[32], &rnding, bit);
    u[32] = half_btf_0_sse4_1(&cospi63, &u[32], &rnding, bit);
    u[39] = half_btf_0_sse4_1(&cospim57, &u[56], &rnding, bit);
    u[56] = half_btf_0_sse4_1(&cospi7, &u[56], &rnding, bit);
    u[55] = half_btf_0_sse4_1(&cospi5, &u[40], &rnding, bit);
    u[40] = half_btf_0_sse4_1(&cospi59, &u[40], &rnding, bit);
    u[47] = half_btf_0_sse4_1(&cospim61, &u[48], &rnding, bit);
    u[48] = half_btf_0_sse4_1(&cospi3, &u[48], &rnding, bit);

    // stage 3
    u[31] = half_btf_0_sse4_1(&cospi2, &u[16], &rnding, bit);
    u[16] = half_btf_0_sse4_1(&cospi62, &u[16], &rnding, bit);
    u[23] = half_btf_0_sse4_1(&cospim58, &u[24], &rnding, bit);
    u[24] = half_btf_0_sse4_1(&cospi6, &u[24], &rnding, bit);
    u[33] = u[32];
    u[38] = u[39];
    u[41] = u[40];
    u[46] = u[47];
    u[49] = u[48];
    u[54] = u[55];
    u[57] = u[56];
    u[62] = u[63];

    // stage 4
    __m128i temp1, temp2;
    u[15] = half_btf_0_sse4_1(&cospi4, &u[8], &rnding, bit);
    u[8] = half_btf_0_sse4_1(&cospi60, &u[8], &rnding, bit);
    u[17] = u[16];
    u[22] = u[23];
    u[25] = u[24];
    u[30] = u[31];

    temp1 = half_btf_sse4_1(&cospim4, &u[33], &cospi60, &u[62], &rnding, bit);
    u[62] = half_btf_sse4_1(&cospi60, &u[33], &cospi4, &u[62], &rnding, bit);
    u[33] = temp1;

    temp2 = half_btf_sse4_1(&cospim36, &u[38], &cospi28, &u[57], &rnding, bit);
    u[38] = half_btf_sse4_1(&cospim28, &u[38], &cospim36, &u[57], &rnding, bit);
    u[57] = temp2;

    temp1 = half_btf_sse4_1(&cospim20, &u[41], &cospi44, &u[54], &rnding, bit);
    u[54] = half_btf_sse4_1(&cospi44, &u[41], &cospi20, &u[54], &rnding, bit);
    u[41] = temp1;

    temp2 = half_btf_sse4_1(&cospim12, &u[46], &cospim52, &u[49], &rnding, bit);
    u[49] = half_btf_sse4_1(&cospim52, &u[46], &cospi12, &u[49], &rnding, bit);
    u[46] = temp2;

    // stage 5
    u[9] = u[8];
    u[14] = u[15];

    temp1 = half_btf_sse4_1(&cospim8, &u[17], &cospi56, &u[30], &rnding, bit);
    u[30] = half_btf_sse4_1(&cospi56, &u[17], &cospi8, &u[30], &rnding, bit);
    u[17] = temp1;

    temp2 = half_btf_sse4_1(&cospim24, &u[22], &cospim40, &u[25], &rnding, bit);
    u[25] = half_btf_sse4_1(&cospim40, &u[22], &cospi24, &u[25], &rnding, bit);
    u[22] = temp2;

    u[35] = u[32];
    u[34] = u[33];
    u[36] = u[39];
    u[37] = u[38];
    u[43] = u[40];
    u[42] = u[41];
    u[44] = u[47];
    u[45] = u[46];
    u[51] = u[48];
    u[50] = u[49];
    u[52] = u[55];
    u[53] = u[54];
    u[59] = u[56];
    u[58] = u[57];
    u[60] = u[63];
    u[61] = u[62];

    // stage 6
    temp1 = half_btf_0_sse4_1(&cospi32, &u[0], &rnding, bit);
    u[1] = half_btf_0_sse4_1(&cospi32, &u[0], &rnding, bit);
    u[0] = temp1;

    temp2 = half_btf_sse4_1(&cospim16, &u[9], &cospi48, &u[14], &rnding, bit);
    u[14] = half_btf_sse4_1(&cospi48, &u[9], &cospi16, &u[14], &rnding, bit);
    u[9] = temp2;
    u[19] = u[16];
    u[18] = u[17];
    u[20] = u[23];
    u[21] = u[22];
    u[27] = u[24];
    u[26] = u[25];
    u[28] = u[31];
    u[29] = u[30];

    temp1 = half_btf_sse4_1(&cospim8, &u[34], &cospi56, &u[61], &rnding, bit);
    u[61] = half_btf_sse4_1(&cospi56, &u[34], &cospi8, &u[61], &rnding, bit);
    u[34] = temp1;
    temp2 = half_btf_sse4_1(&cospim8, &u[35], &cospi56, &u[60], &rnding, bit);
    u[60] = half_btf_sse4_1(&cospi56, &u[35], &cospi8, &u[60], &rnding, bit);
    u[35] = temp2;
    temp1 = half_btf_sse4_1(&cospim56, &u[36], &cospim8, &u[59], &rnding, bit);
    u[59] = half_btf_sse4_1(&cospim8, &u[36], &cospi56, &u[59], &rnding, bit);
    u[36] = temp1;
    temp2 = half_btf_sse4_1(&cospim56, &u[37], &cospim8, &u[58], &rnding, bit);
    u[58] = half_btf_sse4_1(&cospim8, &u[37], &cospi56, &u[58], &rnding, bit);
    u[37] = temp2;
    temp1 = half_btf_sse4_1(&cospim40, &u[42], &cospi24, &u[53], &rnding, bit);
    u[53] = half_btf_sse4_1(&cospi24, &u[42], &cospi40, &u[53], &rnding, bit);
    u[42] = temp1;
    temp2 = half_btf_sse4_1(&cospim40, &u[43], &cospi24, &u[52], &rnding, bit);
    u[52] = half_btf_sse4_1(&cospi24, &u[43], &cospi40, &u[52], &rnding, bit);
    u[43] = temp2;
    temp1 = half_btf_sse4_1(&cospim24, &u[44], &cospim40, &u[51], &rnding, bit);
    u[51] = half_btf_sse4_1(&cospim40, &u[44], &cospi24, &u[51], &rnding, bit);
    u[44] = temp1;
    temp2 = half_btf_sse4_1(&cospim24, &u[45], &cospim40, &u[50], &rnding, bit);
    u[50] = half_btf_sse4_1(&cospim40, &u[45], &cospi24, &u[50], &rnding, bit);
    u[45] = temp2;

    // stage 7
    u[3] = u[0];
    u[2] = u[1];
    u[11] = u[8];
    u[10] = u[9];
    u[12] = u[15];
    u[13] = u[14];

    temp1 = half_btf_sse4_1(&cospim16, &u[18], &cospi48, &u[29], &rnding, bit);
    u[29] = half_btf_sse4_1(&cospi48, &u[18], &cospi16, &u[29], &rnding, bit);
    u[18] = temp1;
    temp2 = half_btf_sse4_1(&cospim16, &u[19], &cospi48, &u[28], &rnding, bit);
    u[28] = half_btf_sse4_1(&cospi48, &u[19], &cospi16, &u[28], &rnding, bit);
    u[19] = temp2;
    temp1 = half_btf_sse4_1(&cospim48, &u[20], &cospim16, &u[27], &rnding, bit);
    u[27] = half_btf_sse4_1(&cospim16, &u[20], &cospi48, &u[27], &rnding, bit);
    u[20] = temp1;
    temp2 = half_btf_sse4_1(&cospim48, &u[21], &cospim16, &u[26], &rnding, bit);
    u[26] = half_btf_sse4_1(&cospim16, &u[21], &cospi48, &u[26], &rnding, bit);
    u[21] = temp2;
    for (i = 32; i < 64; i += 16) {
      for (j = i; j < i + 4; j++) {
        addsub_sse4_1(u[j], u[j ^ 7], &u[j], &u[j ^ 7], &clamp_lo, &clamp_hi);
        addsub_sse4_1(u[j ^ 15], u[j ^ 8], &u[j ^ 15], &u[j ^ 8], &clamp_lo,
                      &clamp_hi);
      }
    }

    // stage 8
    u[7] = u[0];
    u[6] = u[1];
    u[5] = u[2];
    u[4] = u[3];

    idct64_stage8_sse4_1(u, &cospim32, &cospi32, &cospim16, &cospi48, &cospi16,
                         &cospim48, &clamp_lo, &clamp_hi, &rnding, bit);

    // stage 9
    idct64_stage9_sse4_1(u, &cospim32, &cospi32, &clamp_lo, &clamp_hi, &rnding,
                         bit);

    // stage 10
    idct64_stage10_sse4_1(u, &cospim32, &cospi32, &clamp_lo, &clamp_hi, &rnding,
                          bit);

    // stage 11
    idct64_stage11_sse4_1(u, out, do_cols, bd, out_shift, &clamp_lo, &clamp_hi);
  }
}